

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Str_t * Acb_GeneratePatch2(Gia_Man_t *pGia,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Wec_t *p;
  Vec_Ptr_t *p_00;
  Vec_Str_t *p_01;
  void *pvVar6;
  char *pcVar7;
  Vec_Int_t *p_02;
  char *pcVar8;
  char *pName_1;
  Vec_Str_t *vStr;
  Vec_Ptr_t *vNames;
  int fFirst;
  int nWires;
  int iObj;
  int k;
  int i;
  char *pName;
  int nOuts;
  int nIns;
  Vec_Int_t *vGate;
  Vec_Wec_t *vGates;
  Vec_Ptr_t *vOuts_local;
  Vec_Ptr_t *vIns_local;
  Gia_Man_t *pGia_local;
  
  p = Abc_GiaSynthesize((Vec_Ptr_t *)0x0,pGia);
  uVar2 = Vec_PtrSize(vIns);
  uVar3 = Vec_PtrSize(vOuts);
  iVar4 = Vec_WecSize(p);
  uVar5 = (iVar4 - uVar2) - uVar3;
  bVar1 = true;
  p_00 = Acb_GenerateSignalNames2(p,vIns,vOuts);
  p_01 = Vec_StrAlloc(100);
  Vec_StrAppend(p_01,"module patch (");
  for (iObj = 0; iVar4 = Vec_PtrSize(vOuts), iObj < iVar4; iObj = iObj + 1) {
    pvVar6 = Vec_PtrEntry(vOuts,iObj);
    pcVar7 = "";
    if (iObj != 0) {
      pcVar7 = ",";
    }
    Vec_StrPrintF(p_01,"%s %s",pcVar7,pvVar6);
  }
  for (iObj = 0; iVar4 = Vec_PtrSize(vIns), iObj < iVar4; iObj = iObj + 1) {
    pvVar6 = Vec_PtrEntry(vIns,iObj);
    Vec_StrPrintF(p_01,", %s",pvVar6);
  }
  Vec_StrAppend(p_01," );\n\n");
  Vec_StrAppend(p_01,"  output");
  for (iObj = 0; iVar4 = Vec_PtrSize(vOuts), iObj < iVar4; iObj = iObj + 1) {
    pvVar6 = Vec_PtrEntry(vOuts,iObj);
    pcVar7 = "";
    if (iObj != 0) {
      pcVar7 = ",";
    }
    Vec_StrPrintF(p_01,"%s %s",pcVar7,pvVar6);
  }
  Vec_StrAppend(p_01,";\n");
  Vec_StrAppend(p_01,"  input");
  for (iObj = 0; iVar4 = Vec_PtrSize(vIns), iObj < iVar4; iObj = iObj + 1) {
    pvVar6 = Vec_PtrEntry(vIns,iObj);
    pcVar7 = "";
    if (iObj != 0) {
      pcVar7 = ",";
    }
    Vec_StrPrintF(p_01,"%s %s",pcVar7,pvVar6);
  }
  Vec_StrAppend(p_01,";\n");
  iObj = uVar2;
  if ((int)uVar3 < (int)uVar5) {
    Vec_StrAppend(p_01,"  wire");
    for (iObj = 0; iObj < (int)uVar5; iObj = iObj + 1) {
      pcVar7 = (char *)Vec_PtrEntry(p_00,uVar2 + iObj);
      iVar4 = strncmp(pcVar7,"ww",2);
      if (iVar4 == 0) {
        pcVar8 = ",";
        if (bVar1) {
          pcVar8 = "";
        }
        Vec_StrPrintF(p_01,"%s %s",pcVar8,pcVar7);
        bVar1 = false;
      }
    }
    Vec_StrAppend(p_01,";\n\n");
    iObj = uVar2;
  }
  do {
    if ((int)(uVar2 + uVar5) <= iObj) {
      Vec_StrAppend(p_01,"\nendmodule\n\n");
      Vec_StrPush(p_01,'\0');
      Vec_PtrFreeFree(p_00);
      Vec_WecFree(p);
      printf("Synthesized patch with %d inputs, %d outputs and %d gates.\n",(ulong)uVar2,
             (ulong)uVar3,(ulong)uVar5);
      return p_01;
    }
    p_02 = Vec_WecEntry(p,iObj);
    iVar4 = Vec_IntSize(p_02);
    if (iVar4 < 3) {
      iVar4 = Vec_IntEntry(p_02,0);
      if ((iVar4 != 7) && (iVar4 = Vec_IntEntry(p_02,0), iVar4 != 8)) {
        __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x870,"Vec_Str_t *Acb_GeneratePatch2(Gia_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
        ;
      }
      pcVar7 = Acb_Oper2Name(0xb);
      Vec_StrPrintF(p_01,"  %s (",pcVar7);
      iVar4 = Vec_IntEntry(p_02,1);
      pvVar6 = Vec_PtrEntry(p_00,iVar4);
      Vec_StrPrintF(p_01," %s, ",pvVar6);
      iVar4 = Vec_IntEntry(p_02,0);
      Vec_StrPrintF(p_01," 1\'b%d",(ulong)(iVar4 == 8));
      Vec_StrPrintF(p_01," );\n");
    }
    else {
      iVar4 = Vec_IntEntry(p_02,0);
      pcVar7 = Acb_Oper2Name(iVar4);
      Vec_StrPrintF(p_01,"  %s (",pcVar7);
      for (nWires = 1; iVar4 = Vec_IntSize(p_02), nWires < iVar4; nWires = nWires + 1) {
        iVar4 = Vec_IntEntry(p_02,nWires);
        pcVar7 = "";
        if (1 < nWires) {
          pcVar7 = ",";
        }
        pvVar6 = Vec_PtrEntry(p_00,iVar4);
        Vec_StrPrintF(p_01,"%s %s",pcVar7,pvVar6);
      }
      Vec_StrAppend(p_01," );\n");
    }
    iObj = iObj + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Acb_GeneratePatch2( Gia_Man_t * pGia, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = Abc_GiaSynthesize( NULL, pGia );  Vec_Int_t * vGate;
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts); char * pName;
    int i, k, iObj, nWires = Vec_WecSize(vGates) - nIns - nOuts, fFirst = 1;
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames2( vGates, vIns, vOuts );

    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "module patch (" );

    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", %s", pName );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, nIns+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, nIns, nIns+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

    printf( "Synthesized patch with %d inputs, %d outputs and %d gates.\n", nIns, nOuts, nWires );
    return vStr;
}